

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int unicode_prop1(CharRange *cr,int prop_idx)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  int in_ESI;
  uint32_t bit;
  uint32_t b;
  uint32_t c0;
  uint32_t c;
  uint8_t *p_end;
  uint8_t *p;
  uint uVar5;
  byte *local_20;
  
  local_20 = unicode_prop_table[in_ESI];
  pbVar4 = local_20 + (int)(uint)unicode_prop_len_table[in_ESI];
  uVar5 = 0;
  while( true ) {
    if (pbVar4 <= local_20) {
      return 0;
    }
    uVar2 = (uint)*local_20;
    pbVar1 = local_20 + 1;
    if (uVar2 < 0x40) {
      if ((uVar5 != 0) &&
         (iVar3 = cr_add_interval((CharRange *)(ulong)CONCAT14(*local_20,uVar5),0,0x1d12d2),
         iVar3 != 0)) {
        return -1;
      }
      uVar5 = uVar5 ^ 1;
    }
    else if (uVar2 < 0x80) {
      if (uVar2 < 0x60) {
        pbVar1 = local_20 + 2;
      }
      else {
        pbVar1 = local_20 + 3;
      }
    }
    local_20 = pbVar1;
    if ((uVar5 != 0) &&
       (iVar3 = cr_add_interval((CharRange *)CONCAT44(uVar2,uVar5),0,0x1d13bb), iVar3 != 0)) break;
    uVar5 = uVar5 ^ 1;
  }
  return -1;
}

Assistant:

static int unicode_prop1(CharRange *cr, int prop_idx)
{
    const uint8_t *p, *p_end;
    uint32_t c, c0, b, bit;

    p = unicode_prop_table[prop_idx];
    p_end = p + unicode_prop_len_table[prop_idx];
    c = 0;
    bit = 0;
    while (p < p_end) {
        c0 = c;
        b = *p++;
        if (b < 64) {
            c += (b >> 3) + 1;
            if (bit)  {
                if (cr_add_interval(cr, c0, c))
                    return -1;
            }
            bit ^= 1;
            c0 = c;
            c += (b & 7) + 1;
        } else if (b >= 0x80) {
            c += b - 0x80 + 1;
        } else if (b < 0x60) {
            c += (((b - 0x40) << 8) | p[0]) + 1;
            p++;
        } else {
            c += (((b - 0x60) << 16) | (p[0] << 8) | p[1]) + 1;
            p += 2;
        }
        if (bit)  {
            if (cr_add_interval(cr, c0, c))
                return -1;
        }
        bit ^= 1;
    }
    return 0;
}